

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  int iVar1;
  value_type *ppcVar2;
  iterator ppcVar3;
  value_type *ppcVar4;
  uint local_54;
  uint local_34;
  int i_2;
  int first;
  int i_1;
  int local_1c;
  char *pcStack_18;
  int i;
  char *command_line_local;
  ExampleAppConsole *this_local;
  
  pcStack_18 = command_line;
  command_line_local = this->InputBuf;
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  local_1c = (this->History).Size;
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) goto LAB_001e4253;
    ppcVar2 = ImVector<char_*>::operator[](&this->History,local_1c);
    iVar1 = Stricmp(*ppcVar2,pcStack_18);
  } while (iVar1 != 0);
  ppcVar2 = ImVector<char_*>::operator[](&this->History,local_1c);
  free(*ppcVar2);
  ppcVar3 = ImVector<char_*>::begin(&this->History);
  ImVector<char_*>::erase(&this->History,ppcVar3 + local_1c);
LAB_001e4253:
  _first = Strdup(pcStack_18);
  ImVector<char_*>::push_back(&this->History,(value_type *)&first);
  iVar1 = Stricmp(pcStack_18,"CLEAR");
  if (iVar1 == 0) {
    ClearLog(this);
  }
  else {
    iVar1 = Stricmp(pcStack_18,"HELP");
    if (iVar1 == 0) {
      AddLog(this,"Commands:");
      for (i_2 = 0; i_2 < (this->Commands).Size; i_2 = i_2 + 1) {
        ppcVar4 = ImVector<const_char_*>::operator[](&this->Commands,i_2);
        AddLog(this,"- %s",*ppcVar4);
      }
    }
    else {
      iVar1 = Stricmp(pcStack_18,"HISTORY");
      if (iVar1 == 0) {
        local_54 = (this->History).Size - 10;
        if ((int)local_54 < 1) {
          local_54 = 0;
        }
        for (local_34 = local_54; (int)local_34 < (this->History).Size; local_34 = local_34 + 1) {
          ppcVar2 = ImVector<char_*>::operator[](&this->History,local_34);
          AddLog(this,"%3d: %s\n",(ulong)local_34,*ppcVar2);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",pcStack_18);
      }
    }
  }
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back. This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size-1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }
    }